

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

bool __thiscall R2Rect::InteriorContains(R2Rect *this,R2Rect *other)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  
  dVar1 = other->bounds_[0].bounds_.c_[0];
  dVar2 = other->bounds_[0].bounds_.c_[1];
  if (dVar1 <= dVar2) {
    if (dVar1 < this->bounds_[0].bounds_.c_[0] || dVar1 == this->bounds_[0].bounds_.c_[0]) {
      return false;
    }
    if (this->bounds_[0].bounds_.c_[1] <= dVar2) {
      return false;
    }
  }
  dVar1 = other->bounds_[1].bounds_.c_[0];
  dVar2 = other->bounds_[1].bounds_.c_[1];
  bVar3 = true;
  if (dVar1 <= dVar2) {
    if (dVar1 < this->bounds_[1].bounds_.c_[0] || dVar1 == this->bounds_[1].bounds_.c_[0]) {
      return false;
    }
    bVar3 = dVar2 < this->bounds_[1].bounds_.c_[1];
  }
  return bVar3;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }